

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

int Dau_DecPerform6(word *p,int nVars,uint uSet)

{
  int iVar1;
  int iVar2;
  word wVar3;
  word wVar4;
  byte bVar5;
  ulong local_910;
  ulong local_908;
  ulong local_900;
  word MintD;
  word MintC;
  int Counter;
  int ResD;
  int ResC;
  int status;
  int v;
  int m;
  int i;
  int nPairs;
  int nVarsF;
  int nVarsU;
  int nVarsS;
  int nVarsD;
  int nVarsC;
  int pPermD [16];
  int pPermC [16];
  char pDsdD [1000];
  char local_448 [8];
  char pDsdC [1000];
  word FuncD;
  word FuncC;
  word tComp1;
  word tComp0;
  word tDec0;
  word tDec;
  word tComp;
  uint uSet_local;
  int nVars_local;
  word *p_local;
  
  tDec = 0;
  tDec0 = 0;
  tComp._0_4_ = uSet;
  tComp._4_4_ = nVars;
  _uSet_local = p;
  iVar1 = Dau_DecDecomposeSet(p,nVars,uSet,&tDec,&tComp0,pPermD + 0xe,&nVarsD,&nVarsS,&nVarsU,
                              &nVarsF);
  if (iVar1 == 0) {
    printf("  Decomposition does not exist\n");
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = nVarsU - nVarsF;
    iVar2 = (nVarsS - nVarsF) + -1;
    wVar3 = Abc_Tt6Cofactor0(tDec,iVar2 + nVarsF);
    wVar4 = Abc_Tt6Cofactor1(tDec,iVar2 + nVarsF);
    bVar5 = (byte)nVarsF;
    for (v = 0; v < 1 << ((byte)(1 << (bVar5 & 0x1f)) & 0x1f); v = v + 1) {
      if ((v & 1U) == 0) {
        pDsdC[0x3e0] = '\0';
        pDsdC[0x3e1] = '\0';
        pDsdC[0x3e2] = '\0';
        pDsdC[0x3e3] = '\0';
        pDsdC[0x3e4] = '\0';
        pDsdC[0x3e5] = '\0';
        pDsdC[0x3e6] = '\0';
        pDsdC[999] = '\0';
        FuncD = 0;
        for (status = 0; status < 1 << ((byte)nVarsF & 0x1f); status = status + 1) {
          if ((v >> ((byte)status & 0x1f) & 1U) != 0) {
            local_900 = 0xffffffffffffffff;
            MintD = 0xffffffffffffffff;
            for (ResC = 0; ResC < nVarsF; ResC = ResC + 1) {
              if ((status >> ((byte)ResC & 0x1f) & 1U) == 0) {
                local_908 = s_Truths6[iVar2 + ResC] ^ 0xffffffffffffffff;
              }
              else {
                local_908 = s_Truths6[iVar2 + ResC];
              }
              MintD = local_908 & MintD;
              if ((status >> ((byte)ResC & 0x1f) & 1U) == 0) {
                local_910 = s_Truths6[iVar1 + ResC] ^ 0xffffffffffffffff;
              }
              else {
                local_910 = s_Truths6[iVar1 + ResC];
              }
              local_900 = local_910 & local_900;
            }
            FuncD = MintD | FuncD;
            pDsdC._992_8_ = local_900 | pDsdC._992_8_;
          }
        }
        tDec = (s_Truths6[iVar2 + nVarsF] ^ 0xffffffffffffffff) &
               (wVar3 & (FuncD ^ 0xffffffffffffffff) | wVar4 & FuncD) |
               s_Truths6[iVar2 + nVarsF] & (wVar4 & (FuncD ^ 0xffffffffffffffff) | wVar3 & FuncD);
        tDec0 = tComp0 ^ pDsdC._992_8_;
        Dau_DsdDecompose(&tDec,nVarsS,0,1,local_448);
        Dau_DsdDecompose(&tDec0,nVarsU,0,1,(char *)(pPermC + 0xe));
        Dau_DecVarReplace((char *)(pPermC + 0xe),&nVarsD,nVarsU);
        Dau_DecVarReplace(local_448,pPermD + 0xe,nVarsS);
        printf("%3d : ");
        printf("%24s  ",pPermC + 0xe);
        printf("%24s  ",local_448);
        Dau_DecVerify(_uSet_local,tComp._4_4_,local_448,(char *)(pPermC + 0xe));
      }
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Dau_DecPerform6( word * p, int nVars, unsigned uSet )
{
    word tComp = 0, tDec = 0, tDec0, tComp0, tComp1, FuncC, FuncD;
    char pDsdC[1000], pDsdD[1000];
    int pPermC[16], pPermD[16];
    int nVarsC, nVarsD, nVarsS, nVarsU, nVarsF, nPairs;
    int i, m, v, status, ResC, ResD, Counter = 0;
    status = Dau_DecDecomposeSet( p, nVars, uSet, &tComp, &tDec0, pPermC, pPermD, &nVarsC, &nVarsD, &nVarsS );
    if ( !status )
    {
        printf( "  Decomposition does not exist\n" );
        return 0;
    }
    nVarsU = nVarsD - nVarsS;
    nVarsF = nVarsC - nVarsS - 1;
    tComp0 = Abc_Tt6Cofactor0( tComp, nVarsF + nVarsS );
    tComp1 = Abc_Tt6Cofactor1( tComp, nVarsF + nVarsS );
    nPairs = 1 << (1 << nVarsS); 
    for ( i = 0; i < nPairs; i++ )
    {
        if ( i & 1 )
            continue;
        // create miterms with this polarity
        FuncC = FuncD = 0;
        for ( m = 0; m < (1 << nVarsS); m++ )
        {
            word MintC, MintD;
            if ( !((i >> m) & 1) )
                continue;
            MintC = MintD = ~(word)0;
            for ( v = 0; v < nVarsS; v++ )
            {
                MintC &= ((m >> v) & 1) ? s_Truths6[nVarsF+v] : ~s_Truths6[nVarsF+v];
                MintD &= ((m >> v) & 1) ? s_Truths6[nVarsU+v] : ~s_Truths6[nVarsU+v];
            }
            FuncC |= MintC;
            FuncD |= MintD;
        }
        // uncomplement given variables
        tComp = (~s_Truths6[nVarsF + nVarsS] & ((tComp0 & ~FuncC) | (tComp1 & FuncC))) | (s_Truths6[nVarsF + nVarsS] & ((tComp1 & ~FuncC) | (tComp0 & FuncC)));
        tDec = tDec0 ^ FuncD;
        // decompose
        ResC = Dau_DsdDecompose( &tComp, nVarsC, 0, 1, pDsdC );
        ResD = Dau_DsdDecompose( &tDec, nVarsD, 0, 1, pDsdD );
        // replace variables
        Dau_DecVarReplace( pDsdD, pPermD, nVarsD );
        Dau_DecVarReplace( pDsdC, pPermC, nVarsC );
        // report
//        printf( "  " );
        printf( "%3d : ", Counter++ );
        printf( "%24s  ", pDsdD );
        printf( "%24s  ", pDsdC );
        Dau_DecVerify( p, nVars, pDsdC, pDsdD );
    }
    return 1;
}